

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_-1,_1,_true,_true>::
BlockImpl_dense(BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
                *this,Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *xpr,Index i)

{
  ScalarWithConstIfNotLvalue *ptr;
  EVP_PKEY_CTX *ctx;
  Index nbRows;
  Index i_local;
  Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *xpr_local;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
  *this_local;
  
  ptr = TransposeImpl<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Dense>::coeffRef
                  ((TransposeImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Dense> *)xpr,0,i);
  ctx = (EVP_PKEY_CTX *)const_cast_ptr<double>(ptr);
  nbRows = Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::rows(xpr);
  MapBase<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_-1,_1,_true>,_1>::
  MapBase(&this->
           super_MapBase<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true>,_1>
          ,(PointerType)ctx,nbRows,1);
  (this->m_xpr).m_matrix = xpr->m_matrix;
  init(this,ctx);
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }